

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O2

LoopSetInst * __thiscall
UnifiedRegex::Matcher::LabelToInstPointer<UnifiedRegex::LoopSetInst>
          (Matcher *this,InstTag tag,Label label)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Program *pPVar4;
  uchar *puVar5;
  ulong uVar6;
  
  uVar6 = (ulong)label;
  pPVar4 = (this->program).ptr;
  if ((ulong)(pPVar4->rep).insts.instsLen < uVar6 + 0x36) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                       "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar2) goto LAB_00d4a8ad;
    *puVar3 = 0;
    pPVar4 = (this->program).ptr;
  }
  puVar5 = *(uchar **)&pPVar4->rep;
  if (puVar5[uVar6] != tag) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                       ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                       "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar2) {
LAB_00d4a8ad:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    puVar5 = (((this->program).ptr)->rep).insts.insts.ptr;
  }
  return (LoopSetInst *)(puVar5 + uVar6);
}

Assistant:

inline T* LabelToInstPointer(Inst::InstTag tag, Label label) const
        {
            Assert(label + sizeof(T) <= program->rep.insts.instsLen);
            Assert(((Inst*)(program->rep.insts.insts + label))->tag == tag);
            return (T*)(program->rep.insts.insts + label);
        }